

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O0

void __thiscall KDIS::KDataStream::Write<unsigned_int>(KDataStream *this,uint T)

{
  NetToDataType<unsigned_int> local_1e;
  byte local_1d;
  NetToDataType<unsigned_int> local_1c [7];
  KUINT8 i;
  NetToDataType<unsigned_int> OctArray;
  KBOOL bSwapBytes;
  KDataStream *pKStack_10;
  uint T_local;
  KDataStream *this_local;
  
  i = this->m_MachineEndian != this->m_NetEndian;
  OctArray.m_Value = T;
  pKStack_10 = this;
  NetToDataType<unsigned_int>::NetToDataType(local_1c,T,(KBOOL)i);
  for (local_1d = 0; local_1d < 4; local_1d = local_1d + 1) {
    local_1e = local_1c[local_1d];
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vBuffer,(value_type_conflict *)&local_1e);
  }
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}